

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet++.cpp
# Opt level: O2

bool __thiscall
jsonnet::Jsonnet::evaluateSnippet(Jsonnet *this,string *filename,string *snippet,string *output)

{
  char *str;
  string *psVar1;
  bool bVar2;
  int error;
  int local_2c;
  
  if (output == (string *)0x0) {
    bVar2 = false;
  }
  else {
    local_2c = 0;
    str = jsonnet_evaluate_snippet
                    (this->vm_,(filename->_M_dataplus)._M_p,(snippet->_M_dataplus)._M_p,&local_2c);
    bVar2 = local_2c == 0;
    psVar1 = &this->last_error_;
    if (bVar2) {
      psVar1 = output;
    }
    std::__cxx11::string::assign((char *)psVar1);
    jsonnet_realloc(this->vm_,str,0);
  }
  return bVar2;
}

Assistant:

bool Jsonnet::evaluateSnippet(const std::string& filename, const std::string& snippet,
                              std::string* output)
{
    if (output == nullptr) {
        return false;
    }
    int error = 0;
    char* jsonnet_output =
        ::jsonnet_evaluate_snippet(vm_, filename.c_str(), snippet.c_str(), &error);
    if (error != 0) {
        last_error_.assign(jsonnet_output);
        jsonnet_realloc(vm_, jsonnet_output, 0);
        return false;
    }
    output->assign(jsonnet_output);
    jsonnet_realloc(vm_, jsonnet_output, 0);
    return true;
}